

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall
cornerstone::raft_server::on_snapshot_completed
          (raft_server *this,ptr<snapshot> *s,bool result,ptr<std::exception> *err)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  undefined8 uVar4;
  size_t sVar5;
  long *plVar6;
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [23];
  char *local_30;
  
  peVar1 = (err->super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    if (result) {
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,"snapshot created, compact the log store","");
      (*peVar2->_vptr_logger[2])(peVar2,local_f8);
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0],local_e8[0] + 1);
      }
      (this->last_snapshot_).super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (s->super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->last_snapshot_).
                  super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &(s->super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      if ((ulong)(long)*(int *)((long)(((this->ctx_)._M_t.
                                        super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                                        .super__Head_base<0UL,_cornerstone::context_*,_false>.
                                       _M_head_impl)->params_)._M_t.
                                      super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                               + 0x24) <
          ((s->super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          last_log_idx_) {
        (*((this->log_store_).super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->_vptr_log_store[0xc])();
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
      goto LAB_00148a67;
    }
    peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"the state machine rejects to create the snapshot","");
    (*peVar2->_vptr_logger[3])(peVar2,local_f8);
    plVar6 = local_f8[0];
    if (local_f8[0] == local_e8) goto LAB_00148a67;
  }
  else {
    peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30 = "failed to create a snapshot due to %s";
    uVar4 = (**(code **)(*(long *)peVar1 + 0x10))();
    snprintf((char *)local_f8,200,local_30,uVar4);
    local_118[0] = local_108;
    sVar5 = strlen((char *)local_f8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,local_f8,(long)local_f8 + sVar5);
    (*peVar2->_vptr_logger[5])(peVar2,local_118);
    local_e8[0] = local_108[0];
    plVar6 = local_118[0];
    if (local_118[0] == local_108) goto LAB_00148a67;
  }
  operator_delete(plVar6,local_e8[0] + 1);
LAB_00148a67:
  LOCK();
  (this->snp_in_progress_)._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void raft_server::on_snapshot_completed(ptr<snapshot>& s, bool result, const ptr<std::exception>& err)
{
    do
    {
        if (err != nilptr)
        {
            l_->err(lstrfmt("failed to create a snapshot due to %s").fmt(err->what()));
            break;
        }

        if (!result)
        {
            l_->info("the state machine rejects to create the snapshot");
            break;
        }

        {
            recur_lock(lock_);
            l_->debug("snapshot created, compact the log store");

            last_snapshot_ = s;
            if (s->get_last_log_idx() > (ulong)ctx_->params_->reserved_log_items_)
            {
                log_store_->compact(s->get_last_log_idx() - (ulong)ctx_->params_->reserved_log_items_);
            }
        }
    } while (false);
    snp_in_progress_.store(false);
}